

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidExpandDims2(void)

{
  RepeatedField<long> *pRVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  ModelDescription *pMVar5;
  Type *pTVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  TypeUnion this;
  Type *this_00;
  Type *pTVar9;
  LayerUnion this_01;
  WeightParams *pWVar10;
  ostream *poVar11;
  Rep *pRVar12;
  int iVar13;
  int iVar14;
  Result res;
  Model m;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Model local_50;
  
  CoreML::Specification::Model::Model(&local_50);
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_50.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar2 = local_78 + 0x10;
  local_78._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"A","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar2) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7 == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
    pFVar7 = pTVar6->type_;
    if (pFVar7 == (FeatureType *)0x0) {
      pFVar7 = (FeatureType *)operator_new(0x28);
      CoreML::Specification::FeatureType::FeatureType(pFVar7);
      pTVar6->type_ = pFVar7;
    }
  }
  if (pFVar7->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar7->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  iVar14 = (pAVar8->shape_).current_size_;
  if (iVar14 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar8->shape_,iVar14 + 1);
    iVar14 = (pAVar8->shape_).current_size_;
  }
  (pAVar8->shape_).current_size_ = iVar14 + 1;
  ((pAVar8->shape_).rep_)->elements[iVar14] = 2;
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_50.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_78._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"B","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar2) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7 == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar7->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pRVar1 = &pAVar8->shape_;
  iVar14 = (pAVar8->shape_).current_size_;
  iVar13 = (pAVar8->shape_).total_size_;
  if (iVar14 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar14 + 1);
    iVar14 = (pAVar8->shape_).current_size_;
    iVar13 = (pAVar8->shape_).total_size_;
  }
  pRVar12 = (pAVar8->shape_).rep_;
  iVar4 = iVar14 + 1;
  (pAVar8->shape_).current_size_ = iVar4;
  pRVar12->elements[iVar14] = 2;
  if (iVar4 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar14 + 2);
    iVar4 = (pAVar8->shape_).current_size_;
    iVar13 = (pAVar8->shape_).total_size_;
    pRVar12 = (pAVar8->shape_).rep_;
  }
  iVar14 = iVar4 + 1;
  pRVar1->current_size_ = iVar14;
  pRVar12->elements[iVar4] = 1;
  if (iVar14 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar4 + 2);
    iVar14 = (pAVar8->shape_).current_size_;
    pRVar12 = (pAVar8->shape_).rep_;
  }
  pRVar1->current_size_ = iVar14 + 1;
  pRVar12->elements[iVar14] = 1;
  if (local_50._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_50);
    local_50._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_50.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  (local_50.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_50.Type_.pipeline_)->models_,(Type *)0x0);
  local_78._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"ED","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_00->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar2) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"B");
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                     (&(this_00->inputtensor_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar9->rank_ = 1;
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                     (&(this_00->outputtensor_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar9->rank_ = 3;
  if (this_00->_oneof_case_[0] == 0x465) {
    this_01 = this_00->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x465;
    this_01.convolution_ = (ConvolutionLayerParams *)operator_new(0x28);
    CoreML::Specification::ExpandDimsLayerParams::ExpandDimsLayerParams(this_01.expanddims_);
    (this_00->layer_).expanddims_ = (ExpandDimsLayerParams *)this_01;
  }
  pRVar1 = &(this_01.reshape_)->targetshape_;
  iVar14 = ((this_01.convolution_)->kernelsize_).current_size_;
  iVar13 = ((this_01.convolution_)->kernelsize_).total_size_;
  if (iVar14 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar14 + 1);
    iVar14 = ((this_01.convolution_)->kernelsize_).current_size_;
    iVar13 = ((this_01.convolution_)->kernelsize_).total_size_;
  }
  pWVar10 = (this_01.innerproduct_)->bias_;
  iVar4 = iVar14 + 1;
  ((this_01.convolution_)->kernelsize_).current_size_ = iVar4;
  (&pWVar10->_internal_metadata_)[iVar14].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x2;
  if (iVar4 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar14 + 2);
    iVar4 = ((this_01.convolution_)->kernelsize_).current_size_;
    pWVar10 = (this_01.innerproduct_)->bias_;
  }
  pRVar1->current_size_ = iVar4 + 1;
  (&pWVar10->_internal_metadata_)[iVar4].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0xfffffffffffffffc;
  CoreML::validate<(MLModelType)500>((Result *)local_78,&local_50);
  bVar3 = CoreML::Result::good((Result *)local_78);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x131a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._8_8_ != &local_60) {
    operator_delete((void *)local_78._8_8_,local_60._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_50);
  return (uint)bVar3;
}

Assistant:

int testInvalidExpandDims2() {
    /*
     A -> expand dims -> B
     shape of A: (2)
     shape of B: (2, 1, 1)
     axes parameter = [2,-4]
     */
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(2);
    
    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    auto *shape_out = out->mutable_type()->mutable_multiarraytype();
    shape_out->add_shape(2);
    shape_out->add_shape(1);
    shape_out->add_shape(1);
    
    auto *nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    auto *l = nn->add_layers();
    l->set_name("ED");
    l->add_input("A");
    l->add_output("B");
    l->add_inputtensor()->set_rank(1);
    l->add_outputtensor()->set_rank(3);
    auto *params = l->mutable_expanddims();
    params->add_axes(2);
    params->add_axes(-4);
    
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}